

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

op_t * force_reg_or_mem(op_t *__return_storage_ptr__,c2m_ctx_t c2m_ctx,op_t op,MIR_type_t t)

{
  MIR_insn_t_conflict insn;
  op_t *extraout_RAX;
  op_t *poVar1;
  op_t *__return_storage_ptr___00;
  op_t local_98;
  op_t local_58;
  
  poVar1 = &op;
  local_98.mir_op._8_8_ = op.mir_op._8_8_;
  if ((byte)op.mir_op._8_1_ - 8 < 2) {
    local_98.decl = op.decl;
    local_98._8_8_ = op._8_8_;
    local_98.mir_op.data = op.mir_op.data;
    local_98.mir_op.u.i = op.mir_op.u.i;
    local_98.mir_op.u.str.s = op.mir_op.u.str.s;
    local_98.mir_op.u._16_8_ = op.mir_op.u._16_8_;
    local_98.mir_op.u.mem.disp = op.mir_op.u.mem.disp;
    if (op.mir_op._8_1_ == '\x01') {
      __return_storage_ptr___00 = &local_98;
    }
    else {
      __return_storage_ptr___00 = &local_58;
      get_new_temp(__return_storage_ptr___00,c2m_ctx,MIR_T_I64);
      insn = MIR_new_insn(c2m_ctx->ctx,MIR_MOV);
      emit_insn_opt(c2m_ctx,insn);
      poVar1 = extraout_RAX;
    }
    op.decl = __return_storage_ptr___00->decl;
    op._8_8_ = *(undefined8 *)&__return_storage_ptr___00->field_0x8;
    op.mir_op.data = (__return_storage_ptr___00->mir_op).data;
    local_98.mir_op._8_8_ = *(undefined8 *)&(__return_storage_ptr___00->mir_op).field_0x8;
    op.mir_op.u.i = (__return_storage_ptr___00->mir_op).u.i;
    op.mir_op.u.str.s = (__return_storage_ptr___00->mir_op).u.str.s;
    op.mir_op.u._16_8_ = *(undefined8 *)((long)&(__return_storage_ptr___00->mir_op).u + 0x10);
    op.mir_op.u.mem.disp = (__return_storage_ptr___00->mir_op).u.mem.disp;
  }
  else if ((op.mir_op._8_1_ != '\n') && (op.mir_op._8_1_ != '\x01')) {
    __assert_fail("op.mir_op.mode == MIR_OP_REF || op.mir_op.mode == MIR_OP_STR",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x2ae7,"op_t force_reg_or_mem(c2m_ctx_t, op_t, MIR_type_t)");
  }
  __return_storage_ptr__->decl = op.decl;
  *(undefined8 *)&__return_storage_ptr__->field_0x8 = op._8_8_;
  (__return_storage_ptr__->mir_op).data = op.mir_op.data;
  *(undefined8 *)&(__return_storage_ptr__->mir_op).field_0x8 = local_98.mir_op._8_8_;
  (__return_storage_ptr__->mir_op).u.i = op.mir_op.u.i;
  (__return_storage_ptr__->mir_op).u.str.s = op.mir_op.u.str.s;
  *(undefined8 *)((long)&(__return_storage_ptr__->mir_op).u + 0x10) = op.mir_op.u._16_8_;
  (__return_storage_ptr__->mir_op).u.mem.disp = op.mir_op.u.mem.disp;
  return poVar1;
}

Assistant:

static op_t force_reg_or_mem (c2m_ctx_t c2m_ctx, op_t op, MIR_type_t t) {
  if (op.mir_op.mode == MIR_OP_REG || op.mir_op.mode == MIR_OP_MEM) return op;
  assert (op.mir_op.mode == MIR_OP_REF || op.mir_op.mode == MIR_OP_STR);
  return force_reg (c2m_ctx, op, t);
}